

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

file_status ghc::filesystem::symlink_status(path *p)

{
  file_type fVar1;
  undefined8 uVar2;
  file_status in_RDI;
  error_code ec;
  file_status *result;
  int in_stack_000001cc;
  file_status this;
  string *in_stack_ffffffffffffffa8;
  filesystem_error *in_stack_ffffffffffffffb0;
  error_code in_stack_ffffffffffffffb8;
  error_code local_20 [2];
  
  this = in_RDI;
  std::error_code::error_code((error_code *)in_RDI);
  symlink_status((path *)this,(error_code *)in_RDI);
  fVar1 = file_status::type((file_status *)this);
  if (fVar1 != none) {
    return in_RDI;
  }
  uVar2 = __cxa_allocate_exception(0x90);
  std::error_code::value(local_20);
  detail::systemErrorText<int>(in_stack_000001cc);
  filesystem_error::filesystem_error
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb8);
  __cxa_throw(uVar2,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE file_status symlink_status(const path& p)
{
    std::error_code ec;
    auto result = symlink_status(p, ec);
    if (result.type() == file_type::none) {
        throw filesystem_error(detail::systemErrorText(ec.value()), ec);
    }
    return result;
}